

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CharStringType2Interpreter.cpp
# Opt level: O3

Byte * __thiscall
CharStringType2Interpreter::InterpretVStemHM
          (CharStringType2Interpreter *this,Byte *inProgramCounter,LongFilePositionType inReadLimit)

{
  EStatusCode EVar1;
  int iVar2;
  
  EVar1 = AddStemsCount(this,(unsigned_short)
                             ((uint)(this->mOperandStack).
                                    super__List_base<CharStringOperand,_std::allocator<CharStringOperand>_>
                                    ._M_impl._M_node._M_size >> 1));
  if ((EVar1 == eSuccess) &&
     (iVar2 = (*this->mImplementationHelper->_vptr_IType2InterpreterImplementation[0x10])
                        (this->mImplementationHelper,this), iVar2 == 0)) {
    std::__cxx11::list<CharStringOperand,_std::allocator<CharStringOperand>_>::clear
              (&this->mOperandStack);
    return inProgramCounter;
  }
  return (Byte *)0x0;
}

Assistant:

Byte* CharStringType2Interpreter::InterpretVStemHM(Byte* inProgramCounter, LongFilePositionType inReadLimit)
{
	EStatusCode status = AddStemsCount((unsigned short)(mOperandStack.size() / 2));
	if(status != eSuccess)
		return NULL;	

	status = mImplementationHelper->Type2Vstemhm(mOperandStack);
	if(status != eSuccess)
		return NULL;

	ClearStack();
	return inProgramCounter;
}